

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bc7enc.c
# Opt level: O0

uint64_t evaluate_solution(color_quad_u8 *pLow,color_quad_u8 *pHigh,uint32_t *pbits,
                          color_cell_compressor_params *pParams,
                          color_cell_compressor_results *pResults)

{
  byte bVar1;
  uint uVar2;
  color_quad_u8 cVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int i_00;
  int i_01;
  int i_02;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int32_t iVar12;
  color_quad_u8 *pcVar13;
  uint64_t uVar14;
  ulong uVar15;
  color_cell_compressor_params *in_RCX;
  undefined4 *in_RDX;
  uint8_t (*in_RSI) [4];
  uint8_t (*in_RDI) [4];
  ulong *in_R8;
  float fVar16;
  float fVar17;
  uint64_t err_1;
  uint32_t j_2;
  uint64_t err;
  uint32_t j_1;
  uint32_t best_sel_2;
  uint64_t best_err_1;
  uint32_t i_3;
  uint64_t best_err;
  int best_sel_1;
  uint64_t err1_1;
  uint64_t err0_1;
  int sel;
  int b_1;
  int g_1;
  int r_1;
  color_quad_u8 *pC_1;
  uint32_t i_2;
  float f_1;
  uint64_t err1;
  uint64_t err0;
  int best_sel;
  int a;
  int b;
  int g;
  int r;
  color_quad_u8 *pC;
  uint32_t i_1;
  float f;
  int da;
  int la;
  uint64_t total_err;
  int db;
  int dg;
  int dr;
  int lb;
  int lg;
  int lr;
  uint32_t j;
  uint32_t i;
  uint32_t nc;
  color_quad_u8 weightedColors [16];
  uint32_t N;
  color_quad_u8 actualMaxColor;
  color_quad_u8 actualMinColor;
  uint32_t maxPBit;
  uint32_t minPBit;
  color_quad_u8 quantMaxColor;
  color_quad_u8 quantMinColor;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  undefined4 in_stack_fffffffffffffe84;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  uint local_15c;
  uint local_150;
  uint local_14c;
  ulong local_148;
  uint local_13c;
  uint64_t local_138;
  int32_t local_12c;
  uint local_100;
  uint64_t local_f8;
  char local_e4;
  uint local_c8;
  ulong local_b8;
  uint local_94;
  uint local_90;
  color_quad_u8 local_88 [17];
  uint local_44;
  uint8_t local_40 [4];
  uint8_t local_3c [4];
  undefined4 local_38;
  undefined4 local_34;
  color_quad_u8 local_30;
  color_quad_u8 local_2c;
  ulong *local_28;
  color_cell_compressor_params *local_20;
  undefined4 *local_18;
  uint8_t (*local_10) [4];
  uint8_t (*local_8) [4];
  
  local_2c.m_c = *in_RDI;
  local_30.m_c = *in_RSI;
  if (in_RCX->m_has_pbits != '\0') {
    if (in_RCX->m_endpoints_share_pbit == '\0') {
      local_34 = *in_RDX;
      local_38 = in_RDX[1];
    }
    else {
      local_38 = *in_RDX;
      local_34 = local_38;
    }
    bVar1 = (byte)local_34;
    local_2c.m_c[1] = (*in_RDI)[1] << 1 | bVar1;
    local_2c.m_c[0] = (*in_RDI)[0] << 1 | bVar1;
    local_2c.m_c[2] = (*in_RDI)[2] << 1 | bVar1;
    local_2c.m_c[3] = (*in_RDI)[3] << 1 | bVar1;
    bVar1 = (byte)local_38;
    local_30.m_c[1] = (*in_RSI)[1] << 1 | bVar1;
    local_30.m_c[0] = (*in_RSI)[0] << 1 | bVar1;
    local_30.m_c[2] = (*in_RSI)[2] << 1 | bVar1;
    local_30.m_c[3] = (*in_RSI)[3] << 1 | bVar1;
  }
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_3c = (uint8_t  [4])scale_color(&local_2c,in_RCX);
  cVar3 = scale_color(&local_30,local_20);
  local_40[0] = cVar3.m_c[0];
  local_40[1] = cVar3.m_c[1];
  local_40[2] = cVar3.m_c[2];
  local_40[3] = cVar3.m_c[3];
  local_44 = local_20->m_num_selector_weights;
  local_88[0].m_c[0] = local_3c[0];
  local_88[0].m_c[1] = local_3c[1];
  local_88[0].m_c[2] = local_3c[2];
  local_88[0].m_c[3] = local_3c[3];
  *&local_88[local_44 - 1].m_c = cVar3.m_c;
  uVar4 = 3;
  if (local_20->m_has_alpha != '\0') {
    uVar4 = 4;
  }
  for (local_90 = 1; local_90 < local_44 - 1; local_90 = local_90 + 1) {
    for (local_94 = 0; local_94 < uVar4; local_94 = local_94 + 1) {
      local_88[local_90].m_c[local_94] =
           (uint8_t)((uint)local_3c[local_94] * (0x40 - local_20->m_pSelector_weights[local_90]) +
                     (uint)local_40[local_94] * local_20->m_pSelector_weights[local_90] + 0x20 >> 6)
      ;
    }
  }
  uVar4 = (uint)local_3c & 0xff;
  uVar5 = (uint)local_3c >> 8 & 0xff;
  uVar6 = (uint)local_3c >> 0x10 & 0xff;
  i_00 = ((uint)local_40 & 0xff) - uVar4;
  i_01 = ((uint)local_40 >> 8 & 0xff) - uVar5;
  i_02 = ((uint)local_40 >> 0x10 & 0xff) - uVar6;
  local_b8 = 0;
  if (local_20->m_perceptual == '\0') {
    if (local_20->m_has_alpha == '\0') {
      uVar15 = (ulong)local_44;
      iVar8 = squarei(i_00);
      iVar7 = squarei(i_01);
      iVar8 = iVar8 + iVar7;
      iVar7 = squarei(i_02);
      for (local_100 = 0; local_100 < local_20->m_num_pixels; local_100 = local_100 + 1) {
        pcVar13 = local_20->m_pPixels + local_100;
        local_12c = clampi((int)((float)(int)((pcVar13->m_c[0] - uVar4) * i_00 +
                                              (pcVar13->m_c[1] - uVar5) * i_01 +
                                             (pcVar13->m_c[2] - uVar6) * i_02) *
                                 ((float)uVar15 / ((float)(iVar8 + iVar7) + 1.25e-06)) + 0.5),1,
                           local_44 - 1);
        uVar14 = compute_color_distance_rgb
                           (local_88 + (local_12c + -1),pcVar13,'\0',local_20->m_weights);
        local_138 = compute_color_distance_rgb
                              (local_88 + local_12c,pcVar13,'\0',local_20->m_weights);
        if (uVar14 < local_138) {
          local_12c = local_12c + -1;
          local_138 = uVar14;
        }
        local_b8 = local_138 + local_b8;
        *(char *)(local_28[4] + (ulong)local_100) = (char)local_12c;
      }
    }
    else {
      uVar2 = (uint)local_3c >> 0x18;
      iVar7 = ((uint)local_40 >> 0x18) - uVar2;
      fVar16 = (float)local_44;
      iVar8 = squarei(i_00);
      iVar9 = squarei(i_01);
      iVar9 = iVar8 + iVar9;
      iVar10 = squarei(i_02);
      iVar10 = iVar9 + iVar10;
      iVar11 = squarei(iVar7);
      fVar17 = fVar16 / ((float)(iVar10 + iVar11) + 1.25e-06);
      for (local_c8 = 0; local_c8 < local_20->m_num_pixels; local_c8 = local_c8 + 1) {
        pcVar13 = local_20->m_pPixels + local_c8;
        iVar12 = clampi((int)((float)(int)((pcVar13->m_c[0] - uVar4) * i_00 +
                                           (pcVar13->m_c[1] - uVar5) * i_01 +
                                           (pcVar13->m_c[2] - uVar6) * i_02 +
                                          (pcVar13->m_c[3] - uVar2) * iVar7) * fVar17 + 0.5),1,
                        local_44 - 1);
        local_e4 = (char)iVar12;
        uVar14 = compute_color_distance_rgba
                           ((color_quad_u8 *)CONCAT44(iVar10,fVar16),
                            (color_quad_u8 *)CONCAT44(iVar9,iVar8),
                            (bc7enc_bool)((uint)in_stack_fffffffffffffe84 >> 0x18),
                            (uint32_t *)
                            CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
        local_f8 = compute_color_distance_rgba
                             ((color_quad_u8 *)CONCAT44(iVar10,fVar16),
                              (color_quad_u8 *)CONCAT44(iVar9,iVar8),
                              (bc7enc_bool)((uint)in_stack_fffffffffffffe84 >> 0x18),
                              (uint32_t *)
                              CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
        if (uVar14 < local_f8) {
          local_e4 = local_e4 + -1;
          local_f8 = uVar14;
        }
        local_b8 = local_f8 + local_b8;
        *(char *)(local_28[4] + (ulong)local_c8) = local_e4;
      }
    }
  }
  else {
    for (local_13c = 0; local_13c < local_20->m_num_pixels; local_13c = local_13c + 1) {
      local_148 = 0xffffffffffffffff;
      local_14c = 0;
      if (local_20->m_has_alpha == '\0') {
        for (local_15c = 0; local_15c < local_44; local_15c = local_15c + 1) {
          uVar14 = compute_color_distance_rgb
                             (local_88 + local_15c,local_20->m_pPixels + local_13c,'\x01',
                              local_20->m_weights);
          if (uVar14 < local_148) {
            local_14c = local_15c;
            local_148 = uVar14;
          }
        }
      }
      else {
        for (local_150 = 0; local_150 < local_44; local_150 = local_150 + 1) {
          uVar14 = compute_color_distance_rgba
                             ((color_quad_u8 *)
                              CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                              (color_quad_u8 *)
                              CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                              (bc7enc_bool)((uint)in_stack_fffffffffffffe84 >> 0x18),
                              (uint32_t *)
                              CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
          if (uVar14 < local_148) {
            local_14c = local_150;
            local_148 = uVar14;
          }
        }
      }
      local_b8 = local_148 + local_b8;
      *(undefined1 *)(local_28[4] + (ulong)local_13c) = (undefined1)local_14c;
    }
  }
  if (local_b8 < *local_28) {
    *local_28 = local_b8;
    *(uint8_t (*) [4])(local_28 + 1) = *local_8;
    *(uint8_t (*) [4])((long)local_28 + 0xc) = *local_10;
    *(undefined4 *)(local_28 + 2) = *local_18;
    *(undefined4 *)((long)local_28 + 0x14) = local_18[1];
    memcpy((void *)local_28[3],(void *)local_28[4],(ulong)local_20->m_num_pixels);
  }
  return local_b8;
}

Assistant:

static uint64_t evaluate_solution(const color_quad_u8 *pLow, const color_quad_u8 *pHigh, const uint32_t pbits[2], const color_cell_compressor_params *pParams, color_cell_compressor_results *pResults)
{
	color_quad_u8 quantMinColor = *pLow;
	color_quad_u8 quantMaxColor = *pHigh;

	if (pParams->m_has_pbits)
	{
		uint32_t minPBit, maxPBit;

		if (pParams->m_endpoints_share_pbit)
			maxPBit = minPBit = pbits[0];
		else
		{
			minPBit = pbits[0];
			maxPBit = pbits[1];
		}

		quantMinColor.m_c[0] = (uint8_t)((pLow->m_c[0] << 1) | minPBit);
		quantMinColor.m_c[1] = (uint8_t)((pLow->m_c[1] << 1) | minPBit);
		quantMinColor.m_c[2] = (uint8_t)((pLow->m_c[2] << 1) | minPBit);
		quantMinColor.m_c[3] = (uint8_t)((pLow->m_c[3] << 1) | minPBit);

		quantMaxColor.m_c[0] = (uint8_t)((pHigh->m_c[0] << 1) | maxPBit);
		quantMaxColor.m_c[1] = (uint8_t)((pHigh->m_c[1] << 1) | maxPBit);
		quantMaxColor.m_c[2] = (uint8_t)((pHigh->m_c[2] << 1) | maxPBit);
		quantMaxColor.m_c[3] = (uint8_t)((pHigh->m_c[3] << 1) | maxPBit);
	}

	color_quad_u8 actualMinColor = scale_color(&quantMinColor, pParams);
	color_quad_u8 actualMaxColor = scale_color(&quantMaxColor, pParams);

	const uint32_t N = pParams->m_num_selector_weights;

	color_quad_u8 weightedColors[16];
	weightedColors[0] = actualMinColor;
	weightedColors[N - 1] = actualMaxColor;

	const uint32_t nc = pParams->m_has_alpha ? 4 : 3;
	for (uint32_t i = 1; i < (N - 1); i++)
		for (uint32_t j = 0; j < nc; j++)
			weightedColors[i].m_c[j] = (uint8_t)((actualMinColor.m_c[j] * (64 - pParams->m_pSelector_weights[i]) + actualMaxColor.m_c[j] * pParams->m_pSelector_weights[i] + 32) >> 6);

	const int lr = actualMinColor.m_c[0];
	const int lg = actualMinColor.m_c[1];
	const int lb = actualMinColor.m_c[2];
	const int dr = actualMaxColor.m_c[0] - lr;
	const int dg = actualMaxColor.m_c[1] - lg;
	const int db = actualMaxColor.m_c[2] - lb;
	
	uint64_t total_err = 0;
	
	if (!pParams->m_perceptual)
	{
		if (pParams->m_has_alpha)
		{
			const int la = actualMinColor.m_c[3];
			const int da = actualMaxColor.m_c[3] - la;

			const float f = N / (float)(squarei(dr) + squarei(dg) + squarei(db) + squarei(da) + .00000125f);

			for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
			{
				const color_quad_u8 *pC = &pParams->m_pPixels[i];
				int r = pC->m_c[0];
				int g = pC->m_c[1];
				int b = pC->m_c[2];
				int a = pC->m_c[3];

				int best_sel = (int)((float)((r - lr) * dr + (g - lg) * dg + (b - lb) * db + (a - la) * da) * f + .5f);
				best_sel = clampi(best_sel, 1, N - 1);

				uint64_t err0 = compute_color_distance_rgba(&weightedColors[best_sel - 1], pC, BC7ENC_FALSE, pParams->m_weights);
				uint64_t err1 = compute_color_distance_rgba(&weightedColors[best_sel], pC, BC7ENC_FALSE, pParams->m_weights);

				if (err1 > err0)
				{
					err1 = err0;
					--best_sel;
				}
				total_err += err1;

				pResults->m_pSelectors_temp[i] = (uint8_t)best_sel;
			}
		}
		else
		{
			const float f = N / (float)(squarei(dr) + squarei(dg) + squarei(db) + .00000125f);

			for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
			{
				const color_quad_u8 *pC = &pParams->m_pPixels[i];
				int r = pC->m_c[0];
				int g = pC->m_c[1];
				int b = pC->m_c[2];

				int sel = (int)((float)((r - lr) * dr + (g - lg) * dg + (b - lb) * db) * f + .5f);
				sel = clampi(sel, 1, N - 1);

				uint64_t err0 = compute_color_distance_rgb(&weightedColors[sel - 1], pC, BC7ENC_FALSE, pParams->m_weights);
				uint64_t err1 = compute_color_distance_rgb(&weightedColors[sel], pC, BC7ENC_FALSE, pParams->m_weights);

				int best_sel = sel;
				uint64_t best_err = err1;
				if (err0 < best_err)
				{
					best_err = err0;
					best_sel = sel - 1;
				}

				total_err += best_err;

				pResults->m_pSelectors_temp[i] = (uint8_t)best_sel;
			}
		}
	}
	else
	{
		// TODO: This could be improved.
		for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
		{
			uint64_t best_err = UINT64_MAX;
			uint32_t best_sel = 0;

			if (pParams->m_has_alpha)
			{
				for (uint32_t j = 0; j < N; j++)
				{
					uint64_t err = compute_color_distance_rgba(&weightedColors[j], &pParams->m_pPixels[i], BC7ENC_TRUE, pParams->m_weights);
					if (err < best_err)
					{
						best_err = err;
						best_sel = j;
					}
				}
			}
			else
			{
				for (uint32_t j = 0; j < N; j++)
				{
					uint64_t err = compute_color_distance_rgb(&weightedColors[j], &pParams->m_pPixels[i], BC7ENC_TRUE, pParams->m_weights);
					if (err < best_err)
					{
						best_err = err;
						best_sel = j;
					}
				}
			}

			total_err += best_err;

			pResults->m_pSelectors_temp[i] = (uint8_t)best_sel;
		}
	}

	if (total_err < pResults->m_best_overall_err)
	{
		pResults->m_best_overall_err = total_err;

		pResults->m_low_endpoint = *pLow;
		pResults->m_high_endpoint = *pHigh;

		pResults->m_pbits[0] = pbits[0];
		pResults->m_pbits[1] = pbits[1];

		memcpy(pResults->m_pSelectors, pResults->m_pSelectors_temp, sizeof(pResults->m_pSelectors[0]) * pParams->m_num_pixels);
	}
				
	return total_err;
}